

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall Gecko::Graph::relax(Graph *this,bool compatible,uint m)

{
  uint i;
  Progress *pPVar1;
  int iVar2;
  undefined7 in_register_00000031;
  uint uVar3;
  bool bVar4;
  Float FVar5;
  allocator local_49;
  string local_48 [32];
  
  pPVar1 = this->progress;
  if ((int)CONCAT71(in_register_00000031,compatible) == 0) {
    std::__cxx11::string::string(local_48,"frelax",&local_49);
  }
  else {
    std::__cxx11::string::string(local_48,"crelax",&local_49);
  }
  (*pPVar1->_vptr_Progress[6])(pPVar1,this,local_48);
  std::__cxx11::string::_M_dispose();
  do {
    bVar4 = m == 0;
    m = m - 1;
    if (bVar4) {
      place(this,true);
      (*this->progress->_vptr_Progress[7])(this->progress,this,1);
      return;
    }
    for (uVar3 = 0;
        (ulong)uVar3 <
        (ulong)((long)(this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 1) {
      iVar2 = (*this->progress->_vptr_Progress[8])();
      if ((char)iVar2 != '\0') break;
      i = (this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3];
      if ((!compatible) ||
         ((this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
          super__Vector_impl_data._M_start[i].parent == 0)) {
        FVar5 = optimal(this,i);
        (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
        super__Vector_impl_data._M_start[i].pos = FVar5;
      }
    }
  } while( true );
}

Assistant:

void
Graph::relax(bool compatible, uint m)
{
  progress->beginphase(this, compatible ? string("crelax") : string("frelax"));
  while (m--)
    for (uint k = 0; k < perm.size() && !progress->quit(); k++) {
      Node::Index i = perm[k];
      if (!compatible || !persistent(i))
        node[i].pos = optimal(i);
    }
  place(true);
  progress->endphase(this, true);
}